

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoderData.c
# Opt level: O0

void ZydisGetInstructionEncodingInfo(ZydisDecoderTreeNode *node,ZydisInstructionEncodingInfo **info)

{
  byte bVar1;
  ZyanU8 class;
  ZydisInstructionEncodingInfo **info_local;
  ZydisDecoderTreeNode *node_local;
  
  if ((node->type & 0x80) == 0) {
    __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                  ,0xac,
                  "void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode *, const ZydisInstructionEncodingInfo **)"
                 );
  }
  bVar1 = node->type & 0x7f;
  if (bVar1 < 0x14) {
    *info = INSTR_ENCODINGS + bVar1;
    return;
  }
  __assert_fail("class < (sizeof(INSTR_ENCODINGS) / sizeof((INSTR_ENCODINGS)[0]))",
                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/DecoderData.c"
                ,0xae,
                "void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode *, const ZydisInstructionEncodingInfo **)"
               );
}

Assistant:

void ZydisGetInstructionEncodingInfo(const ZydisDecoderTreeNode* node,
    const ZydisInstructionEncodingInfo** info)
{
    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
    const ZyanU8 class = (node->type) & 0x7F;
    ZYAN_ASSERT(class < ZYAN_ARRAY_LENGTH(INSTR_ENCODINGS));
    *info = &INSTR_ENCODINGS[class];
}